

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_54919::SetSourcei64v
          (anon_unknown_dwarf_54919 *this,ALsource *Source,ALCcontext *Context,SourceProp prop,
          span<const_long,_18446744073709551615UL> values)

{
  undefined1 extraout_AL;
  bool bVar1;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  ulong uVar2;
  undefined4 in_register_0000000c;
  ulong *puVar3;
  int iVar4;
  char *msg;
  ALCcontext *Context_00;
  ALenum errorCode;
  pointer plVar5;
  float *pfVar6;
  undefined8 uVar7;
  pointer pfVar8;
  span<const_float,_18446744073709551615UL> values_00;
  span<const_int,_18446744073709551615UL> values_01;
  int ivals [6];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float local_14;
  
  puVar3 = (ulong *)CONCAT44(in_register_0000000c,prop);
  plVar5 = values.mData;
  pfVar6 = (float *)&stack0xfffffffffffffff0;
  iVar4 = (int)Context;
  Context_00 = (ALCcontext *)((ulong)Context & 0xffffffff);
  if (iVar4 < 0x1200) {
    switch(iVar4) {
    case 0x1001:
    case 0x1002:
    case 0x1003:
    case 0x100a:
    case 0x100d:
    case 0x100e:
    case 0x1020:
    case 0x1021:
    case 0x1022:
    case 0x1023:
    case 0x1031:
      goto switchD_00124bb5_caseD_1001;
    case 0x1004:
    case 0x1005:
    case 0x1006:
      pfVar8 = (pointer)((long)plVar5 - (long)puVar3 >> 3);
      if ((pfVar8 != (pointer)0x3) && (pfVar8 != (pointer)0x6)) {
LAB_00124ee2:
        uVar7 = 3;
        goto LAB_00124e55;
      }
      local_28 = (float)(long)*puVar3;
      pfVar6 = &fStack_1c;
      fStack_24 = (float)(long)puVar3[1];
      uVar2 = puVar3[2];
      goto LAB_00124bd8;
    case 0x1007:
    case 0x1024:
    case 0x1025:
    case 0x1026:
    case 0x1033:
      goto switchD_00124bb5_caseD_1007;
    case 0x1008:
    case 0x100b:
    case 0x100c:
    case 0x1011:
    case 0x1012:
    case 0x1013:
    case 0x1014:
    case 0x1017:
    case 0x1018:
    case 0x1019:
    case 0x101a:
    case 0x101b:
    case 0x101c:
    case 0x101d:
    case 0x101e:
    case 0x101f:
    case 0x1028:
    case 0x1029:
    case 0x102a:
    case 0x102b:
    case 0x102c:
    case 0x102d:
    case 0x102e:
    case 0x102f:
    case 0x1030:
    case 0x1032:
switchD_00124bb5_caseD_1008:
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",Context_00);
      }
      msg = "Invalid source integer64 property 0x%04x";
      errorCode = 0xa002;
LAB_00124c74:
      ALCcontext::setError((ALCcontext *)Source,errorCode,msg,Context_00);
      return (bool)extraout_AL;
    case 0x1009:
switchD_00124bb5_caseD_1009:
      pfVar8 = (pointer)((long)plVar5 - (long)puVar3 >> 3);
      if ((pfVar8 != (pointer)0x1) && (pfVar8 != (pointer)0x6)) goto LAB_00124e80;
      uVar2 = *puVar3;
      if (uVar2 >> 0x20 != 0) goto LAB_00124e63;
      goto LAB_00124cc1;
    case 0x100f:
      if ((long)plVar5 - (long)puVar3 == 0x30) {
        fStack_1c = (float)(long)puVar3[3];
        fStack_20 = (float)(long)puVar3[2];
        fStack_24 = (float)(long)puVar3[1];
        local_28 = (float)(long)*puVar3;
        local_18 = (float)(long)puVar3[4];
        local_14 = (float)(long)puVar3[5];
        Context_00 = (ALCcontext *)0x100f;
        pfVar8 = (pointer)0x30;
        goto LAB_00124be7;
      }
      pfVar8 = (pointer)((long)plVar5 - (long)puVar3 >> 3);
      Context_00 = (ALCcontext *)0x100f;
      uVar7 = 6;
      goto LAB_00124e55;
    case 0x1010:
    case 0x1015:
    case 0x1016:
    case 0x1027:
switchD_00124bb5_caseD_1010:
      msg = "Setting read-only source property 0x%04x";
      errorCode = 0xa004;
      goto LAB_00124c74;
    }
    if (iVar4 != 0x202) goto switchD_00124bb5_caseD_1008;
switchD_00124bb5_caseD_1007:
    pfVar8 = (pointer)((long)plVar5 - (long)puVar3 >> 3);
    if ((pfVar8 == (pointer)0x1) || (pfVar8 == (pointer)0x6)) {
      uVar2 = *puVar3;
      if ((long)(int)uVar2 != uVar2) {
LAB_00124e63:
        ALCcontext::setError((ALCcontext *)Source,0xa003,"Value out of range");
        return (bool)extraout_AL_01;
      }
LAB_00124cc1:
      pfVar6 = &fStack_24;
      local_28 = (float)uVar2;
LAB_00124cd3:
      values_01.mDataEnd = (pointer)pfVar8;
      values_01.mData = (pointer)pfVar6;
      bVar1 = SetSourceiv(this,Source,Context_00,(SourceProp)&local_28,values_01);
      return bVar1;
    }
  }
  else {
    if (iVar4 < 0xc000) {
      if (iVar4 < 0x1212) {
        if ((iVar4 == 0x1200) || (iVar4 == 0x1202)) goto switchD_00124bb5_caseD_1010;
      }
      else if ((iVar4 == 0x1212) || (iVar4 == 0x1214)) goto switchD_00124bb5_caseD_1007;
      goto switchD_00124bb5_caseD_1008;
    }
    switch(iVar4) {
    case 0x20005:
      goto switchD_00124bb5_caseD_1009;
    case 0x20006:
      pfVar8 = (pointer)((long)plVar5 - (long)puVar3 >> 3);
      if ((pfVar8 == (pointer)0x3) || (pfVar8 == (pointer)0x6)) {
        if (((*puVar3 >> 0x20 != 0) || (puVar3[1] >> 0x20 != 0)) || (puVar3[2] >> 0x20 != 0))
        goto LAB_00124e63;
        pfVar6 = &fStack_1c;
        local_28 = (float)*puVar3;
        fStack_24 = (float)puVar3[1];
        fStack_20 = (float)puVar3[2];
        Context_00 = (ALCcontext *)0x20006;
        goto LAB_00124cd3;
      }
      Context_00 = (ALCcontext *)0x20006;
      goto LAB_00124ee2;
    case 0x20007:
    case 0x20008:
    case 0x20009:
      goto switchD_00124bb5_caseD_1001;
    case 0x2000a:
    case 0x2000b:
    case 0x2000c:
      goto switchD_00124bb5_caseD_1007;
    }
    if (iVar4 != 0xc000) {
      if (iVar4 != 0xd000) goto switchD_00124bb5_caseD_1008;
      goto switchD_00124bb5_caseD_1007;
    }
switchD_00124bb5_caseD_1001:
    pfVar8 = (pointer)((long)plVar5 - (long)puVar3 >> 3);
    if ((pfVar8 == (pointer)0x1) || (pfVar8 == (pointer)0x6)) {
      uVar2 = *puVar3;
      pfVar6 = &fStack_24;
LAB_00124bd8:
      pfVar6[-1] = (float)(long)uVar2;
LAB_00124be7:
      values_00.mDataEnd = pfVar8;
      values_00.mData = pfVar6;
      bVar1 = SetSourcefv(this,Source,Context_00,(SourceProp)&local_28,values_00);
      return bVar1;
    }
  }
LAB_00124e80:
  uVar7 = 1;
LAB_00124e55:
  ALCcontext::setError
            ((ALCcontext *)Source,0xa002,"Property 0x%04x expects %d value(s), got %zu",Context_00,
             uVar7,pfVar8);
  return (bool)extraout_AL_00;
}

Assistant:

bool SetSourcei64v(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const int64_t> values)
{
    float fvals[MaxValues];
    int   ivals[MaxValues];

    switch(prop)
    {
    case AL_SOURCE_TYPE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
    case AL_SOURCE_STATE:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    /* 1x int */
    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_DISTANCE_MODEL:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] <= INT_MAX && values[0] >= INT_MIN);

        ivals[0] = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {ivals, 1u});

    /* 1x uint */
    case AL_BUFFER:
    case AL_DIRECT_FILTER:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] <= UINT_MAX && values[0] >= 0);

        ivals[0] = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {ivals, 1u});

    /* 3x uint */
    case AL_AUXILIARY_SEND_FILTER:
        CHECKSIZE(values, 3);
        CHECKVAL(values[0] <= UINT_MAX && values[0] >= 0 && values[1] <= UINT_MAX && values[1] >= 0
            && values[2] <= UINT_MAX && values[2] >= 0);

        ivals[0] = static_cast<int>(values[0]);
        ivals[1] = static_cast<int>(values[1]);
        ivals[2] = static_cast<int>(values[2]);
        return SetSourceiv(Source, Context, prop, {ivals, 3u});

    /* 1x float */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_DOPPLER_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        fvals[0] = static_cast<float>(values[0]);
        return SetSourcefv(Source, Context, prop, {fvals, 1u});

    /* 3x float */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        return SetSourcefv(Source, Context, prop, {fvals, 3u});

    /* 6x float */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        fvals[0] = static_cast<float>(values[0]);
        fvals[1] = static_cast<float>(values[1]);
        fvals[2] = static_cast<float>(values[2]);
        fvals[3] = static_cast<float>(values[3]);
        fvals[4] = static_cast<float>(values[4]);
        fvals[5] = static_cast<float>(values[5]);
        return SetSourcefv(Source, Context, prop, {fvals, 6u});

    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
    case AL_STEREO_ANGLES:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer64 property 0x%04x", prop);
    return false;
}